

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamRandomAccessController::LocateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *preferredType)

{
  bool bVar1;
  string message;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  BamReaderPrivate::Filename_abi_cxx11_(&local_80,reader);
  BamIndexFactory::FindIndexFilename(&local_40,&local_80,preferredType);
  std::__cxx11::string::~string((string *)&local_80);
  if (local_40._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_a0,"could not find index file for:",&local_a1);
    BamReaderPrivate::Filename_abi_cxx11_(&local_60,reader);
    std::operator+(&local_80,&local_a0,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string
              ((string *)&local_a0,"BamRandomAccessController::LocateIndex",(allocator *)&local_60);
    SetErrorString(this,&local_a0,&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    bVar1 = false;
  }
  else {
    bVar1 = OpenIndex(this,&local_40,reader);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool BamRandomAccessController::LocateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& preferredType)
{
    // look up index filename, deferring to preferredType if possible
    assert(reader);
    const std::string& indexFilename =
        BamIndexFactory::FindIndexFilename(reader->Filename(), preferredType);

    // if no index file found (of any type)
    if (indexFilename.empty()) {
        const std::string message =
            std::string("could not find index file for:") + reader->Filename();
        SetErrorString("BamRandomAccessController::LocateIndex", message);
        return false;
    }

    // otherwise open & use index file that was found
    return OpenIndex(indexFilename, reader);
}